

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

void __thiscall
Fixpp::Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>::Field
          (Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_> *this,
          Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_> *other)

{
  Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_> *other_local;
  Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_> *this_local;
  
  Type::UTCTimestamp::Time::Time(&this->val_);
  this->empty_ = false;
  operator=(this,other);
  return;
}

Assistant:

Field(const Field& other)
        {
            operator=(other);
        }